

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlist.c
# Opt level: O2

int main(void)

{
  rlist **pprVar1;
  rlist *prVar2;
  test *ptVar3;
  rlist rVar4;
  rlist *prVar5;
  int iVar6;
  long lVar7;
  rlist *prVar8;
  uint uVar9;
  ulong uVar10;
  test *ptVar11;
  bool bVar12;
  rlist tmp;
  rlist empty_list;
  
  plan(0x68);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  _ok((uint)(head.prev == &head && head.next == &head),"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x1a,
      "list is empty");
  ptVar11 = items;
  for (lVar7 = 0; prVar5 = &ptVar11->list, lVar7 != 7; lVar7 = lVar7 + 1) {
    *(int *)((long)(prVar5 + -1) + 8) = (int)lVar7;
    prVar5->next = &head;
    prVar8 = head.prev;
    prVar5->prev = head.prev;
    prVar8->next = prVar5;
    prVar5->next->prev = prVar5;
    ptVar11 = (test *)(prVar5 + 1);
  }
  pprVar1 = &tmp.next;
  empty_list.prev = (rlist *)pprVar1;
  tmp.next = (rlist *)pprVar1;
  _ok(1,"rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x20,
      "rlist_nil is empty");
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x21,
      "head2 is empty");
  rVar4 = head2;
  head2 = stack0xffffffffffffffb8;
  stack0xffffffffffffffb8 = rVar4;
  empty_list.prev = rVar4.next;
  bVar12 = empty_list.prev == &head2;
  prVar5 = empty_list.prev;
  unique0x1000182d = rVar4;
  if (bVar12) {
    tmp.next = rVar4.prev;
    empty_list.prev = (rlist *)pprVar1;
    prVar5 = (rlist *)pprVar1;
  }
  prVar5->prev = (rlist *)pprVar1;
  (tmp.next)->next = (rlist *)pprVar1;
  prVar5 = head2.next;
  if (head2.next == (rlist *)pprVar1) {
    prVar5 = &head2;
    head2.next = &head2;
  }
  prVar5->prev = &head2;
  (head2.prev)->next = &head2;
  _ok((uint)((rlist *)pprVar1 == empty_list.prev && tmp.next == empty_list.prev),
      "rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x23,
      "rlist_nil is empty after swap");
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x24,
      "head2 is empty after swap");
  rVar4 = head;
  head = head2;
  head2 = rVar4;
  head2.next = rVar4.next;
  bVar12 = head2.next == &head;
  prVar5 = head2.next;
  head2 = rVar4;
  if (bVar12) {
    prVar5 = &head2;
    head2.prev = rVar4.prev;
    head2.next = &head2;
  }
  prVar5->prev = &head2;
  (head2.prev)->next = &head2;
  prVar5 = head.next;
  if (head.next == &head2) {
    prVar5 = &head;
    head.next = &head;
  }
  prVar5->prev = &head;
  prVar5 = head.prev;
  (head.prev)->next = &head;
  _ok((uint)(prVar5 == &head && head.next == &head),"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x26,
      "head is empty after swap");
  prVar5 = &head2;
  _ok((uint)(head2.next == &items[0].list),"rlist_first(&head2) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x27,
      "first item");
  _ok((uint)(head2.prev == &items[6].list),"rlist_last(&head2) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x28,
      "last item");
  uVar10 = 0xffffffffffffffff;
  prVar8 = (rlist *)&completed_0;
  while (prVar5 = prVar5->next, prVar5 != &head2) {
    prVar8 = (rlist *)&prVar8[1].next;
    uVar10 = (ulong)((int)uVar10 + 1);
    _ok((uint)(prVar8 == prVar5),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x2b,
        "element (foreach) %d",uVar10,(undefined1  [16])rVar4);
  }
  prVar5 = &head2;
  while (rVar4 = head2, prVar5 = prVar5->prev, prVar5 != &head2) {
    _ok((uint)(prVar8 == prVar5),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x30,
        "element (foreach_reverse) %d",uVar10 & 0xffffffff);
    uVar10 = (ulong)((int)uVar10 - 1);
    prVar8 = (rlist *)&prVar8[-2].next;
  }
  head2 = head;
  head = rVar4;
  head.next = rVar4.next;
  bVar12 = head.next == &head2;
  prVar5 = head.next;
  head = rVar4;
  if (bVar12) {
    prVar5 = &head;
    head.prev = rVar4.prev;
    head.next = &head;
  }
  prVar5->prev = &head;
  (head.prev)->next = &head;
  prVar5 = head2.next;
  if (head2.next == &head) {
    prVar5 = &head2;
    head2.next = &head2;
  }
  prVar5->prev = &head2;
  (head2.prev)->next = &head2;
  prVar5 = &head;
  _ok((uint)(head.next == &items[0].list),"rlist_first(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x35,
      "first item");
  _ok((uint)(head.next != &items[6].list),"rlist_first(&head) != &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x36,
      "first item");
  _ok((uint)(head.prev == &items[6].list),"rlist_last(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x38,
      "last item");
  _ok((uint)(head.prev != &items[0].list),"rlist_last(&head) != &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x39,
      "last item");
  _ok((uint)(head.next == &items[0].list),"rlist_next(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3b,
      "rlist_next");
  _ok((uint)(head.prev == &items[6].list),"rlist_prev(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3c,
      "rlist_prev");
  uVar10 = 0xffffffffffffffff;
  prVar8 = (rlist *)&completed_0;
  while (prVar5 = prVar5->next, prVar5 != &head) {
    prVar8 = (rlist *)&prVar8[1].next;
    uVar10 = (ulong)((int)uVar10 + 1);
    _ok((uint)(prVar8 == prVar5),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x40,
        "element (foreach) %d",uVar10);
  }
  prVar5 = &head;
  while (prVar5 = prVar5->prev, prVar5 != &head) {
    _ok((uint)(prVar8 == prVar5),"rlist == &items[i].list",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x45,
        "element (foreach_reverse) %d",uVar10 & 0xffffffff);
    uVar10 = (ulong)((int)uVar10 - 1);
    prVar8 = (rlist *)&prVar8[-2].next;
  }
  _ok(1,"rlist_entry(&items[0].list, struct test, list) == &items[0]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4a,
      "rlist_entry");
  prVar5 = &head;
  ptVar11 = items;
  _ok((uint)(head.next == &items[0].list),"rlist_first_entry(&head, struct test, list) == &items[0]"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4c,
      "rlist_first_entry");
  _ok((uint)(items[0].list.next == &items[1].list),"rlist_next_entry(&items[0], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4d,
      "rlist_next_entry");
  _ok((uint)(items[2].list.prev == &items[1].list),"rlist_prev_entry(&items[2], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4e,
      "rlist_prev_entry");
  uVar10 = 0;
  while (prVar5 = prVar5->next, prVar5 != &head) {
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x53,
        "element (foreach_entry) %d",uVar10);
    uVar10 = (ulong)((int)uVar10 + 1);
    ptVar11 = ptVar11 + 1;
  }
  prVar5 = &head;
  while( true ) {
    ptVar11 = ptVar11 + -1;
    prVar5 = prVar5->prev;
    if (prVar5 == &head) break;
    uVar10 = (ulong)((int)uVar10 - 1);
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x58,
        "element (foreach_entry_reverse) %d",uVar10);
  }
  (items[2].list.prev)->next = items[2].list.next;
  (items[2].list.next)->prev = items[2].list.prev;
  items[2].list.next = &items[2].list;
  items[2].list.prev = &items[2].list;
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5c,
      "head2 is empty");
  (items[3].list.prev)->next = items[3].list.next;
  (items[3].list.next)->prev = items[3].list.prev;
  items[3].list.prev = &head2;
  prVar5 = head2.next;
  items[3].list.next = head2.next;
  head2.next = &items[3].list;
  prVar5->prev = (rlist *)0x1050e0;
  _ok(1,"!rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5e,
      "head2 isnt empty");
  _ok((uint)(head2.next == &items[3].list),
      "rlist_first_entry(&head2, struct test, list) == &items[3]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x60,
      "Item was moved");
  (items[4].list.prev)->next = items[4].list.next;
  (items[4].list.next)->prev = items[4].list.prev;
  items[4].list.next = &head2;
  items[4].list.prev = head2.prev;
  (head2.prev)->next = &items[4].list;
  (items[4].list.next)->prev = (rlist *)0x1050f8;
  prVar5 = &head;
  ptVar11 = items;
  while (prVar5 = prVar5->next, prVar5 != &head) {
    _ok((uint)((test *)&prVar5[-1].next == items + (int)uVar10),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",99,
        "element (second deleted) %d",uVar10);
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    if (uVar9 == 2) {
      uVar10 = 5;
    }
  }
  prVar5 = &head;
  while (prVar5 = prVar5->prev, prVar5 != &head) {
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    if (uVar9 == 4) {
      uVar10 = 1;
    }
    _ok((uint)((test *)&prVar5[-1].next == items + (int)uVar10),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x6c,
        "element (second deleted) %d");
  }
  head.next = &head;
  head.prev = &head;
  _ok(1,"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x71,
      "list is empty");
  ptVar3 = items;
  prVar5 = head.next;
  for (lVar7 = 0; prVar8 = &ptVar3->list, lVar7 != 7; lVar7 = lVar7 + 1) {
    *(int *)((long)(prVar8 + -1) + 8) = (int)lVar7;
    prVar8->prev = &head;
    prVar8->next = prVar5;
    prVar5->prev = prVar8;
    ptVar3 = (test *)(prVar8 + 1);
    prVar5 = prVar8;
  }
  head.next = prVar5;
  uVar9 = 0xffffffff;
  prVar5 = &head;
  while (prVar5 = prVar5->prev, prVar5 != &head) {
    uVar9 = uVar9 + 1;
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x78,
        "element (foreach_entry_reverse) %d",(ulong)uVar9);
    ptVar11 = ptVar11 + 1;
  }
  prVar5 = &head;
  while( true ) {
    ptVar11 = ptVar11 + -1;
    prVar5 = prVar5->next;
    if (prVar5 == &head) break;
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x7d,
        "element (foreach_entry) %d",(ulong)uVar9);
    uVar9 = uVar9 - 1;
  }
  items[0].list.prev = &head;
  ptVar11 = items;
  items[0].list.next = &head;
  head.next = &items[0].list;
  head.prev = &items[0].list;
  iVar6 = 1;
  _ok(1,"rlist_prev_entry_safe(&items[0], &head, list) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x82,
      "prev is null");
  head.next = &head;
  head.prev = &head;
  _ok(1,"i == 0","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",
      0x88,"list is empty");
  prVar5 = head.next;
  for (lVar7 = 0; prVar8 = &ptVar11->list, lVar7 != 7; lVar7 = lVar7 + 1) {
    *(int *)((long)(prVar8 + -1) + 8) = (int)lVar7;
    prVar8->prev = &head;
    prVar8->next = prVar5;
    prVar5->prev = prVar8;
    ptVar11 = (test *)(prVar8 + 1);
    prVar5 = prVar8;
  }
  head.next = prVar5;
  ptVar11 = items;
  uVar10 = 0;
  prVar5 = head.prev;
  while (prVar5 != &head) {
    prVar8 = prVar5->prev;
    prVar2 = prVar5->next;
    prVar8->next = prVar2;
    prVar2->prev = prVar8;
    prVar5->next = prVar5;
    prVar5->prev = prVar5;
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x90,
        "element (reverse) %d",uVar10);
    ptVar11 = ptVar11 + 1;
    uVar10 = (ulong)((int)uVar10 + 1);
    prVar5 = prVar8;
  }
  items[0].list.prev = &head;
  prVar5 = head.next;
  items[0].list.next = head.next;
  head.next = &items[0].list;
  prVar5->prev = (rlist *)0x105098;
  if (head2.next != &items[0].list) {
    head.next = &items[0].list;
    items[0].list.prev = &head;
  }
  head2.next = &head2;
  head2.prev = &head2;
  _ok(1,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x95,
      "list is empty");
  ptVar11 = items;
  for (lVar7 = 0; lVar7 != 0x90; lVar7 = lVar7 + 0x18) {
    prVar8 = (rlist *)((long)&items[1].list.prev + lVar7);
    *(int *)((long)&items[1].no + lVar7) = iVar6;
    *(rlist **)((long)&items[1].list.next + lVar7) = &head;
    prVar5 = head.prev;
    prVar8->prev = head.prev;
    prVar5->next = prVar8;
    **(undefined8 **)((long)&items[1].list.next + lVar7) = prVar8;
    iVar6 = iVar6 + 1;
  }
  head2.prev = &head2;
  prVar5 = head2.prev;
  head2.prev = &head2;
  if (head2.next == head.next) {
    uVar9 = 1;
  }
  else {
    head2.prev = prVar5;
    (head.next)->prev = &head;
    uVar9 = (uint)(head2.prev == &head2);
  }
  head2.next = &head2;
  _ok(uVar9,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9b,
      "list is empty");
  if (head2.next == &items[3].list) {
    head2.next = &head2;
    head2.prev = &head2;
  }
  else {
    head2.next = head.next;
    (head.next)->prev = &head2;
    head2.prev = items[3].list.prev;
    (items[3].list.prev)->next = &head2;
    head.next = &items[3].list;
    items[3].list.prev = &head;
  }
  prVar5 = &head2;
  uVar9 = 0;
  while (prVar5 = prVar5->next, prVar5 != &head2) {
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9f,
        "element (first half) %d",(ulong)uVar9);
    ptVar11 = ptVar11 + 1;
    uVar9 = uVar9 + 1;
  }
  prVar5 = &head;
  while (prVar5 = prVar5->next, prVar5 != &head) {
    _ok((uint)(ptVar11 == (test *)&prVar5[-1].next),"it == items + i",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0xa3,
        "element (second half) %d",(ulong)uVar9);
    ptVar11 = ptVar11 + 1;
    uVar9 = uVar9 + 1;
  }
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar6 = check_plan();
  return iVar6;
}

Assistant:

int
main(void)
{
	int i;
	struct test *it, *tmp;
	struct rlist *rlist;

	plan(104);
	header();

	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	RLIST_HEAD(empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty");
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_swap(&head2, &empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty after swap");
	ok(rlist_empty(&head2), "head2 is empty after swap");
	rlist_swap(&head, &head2);
	ok(rlist_empty(&head), "head is empty after swap");
	is(rlist_first(&head2), &items[0].list, "first item");
	is(rlist_last(&head2), &items[ITEMS - 1].list, "last item");
	i = 0;
	rlist_foreach(rlist, &head2) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head2) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}
	rlist_swap(&head2, &head);


	is(rlist_first(&head), &items[0].list, "first item");
	isnt(rlist_first(&head), &items[ITEMS - 1].list, "first item");

	is(rlist_last(&head), &items[ITEMS - 1].list, "last item");
	isnt(rlist_last(&head), &items[0].list, "last item");

	is(rlist_next(&head), &items[0].list, "rlist_next");
	is(rlist_prev(&head), &items[ITEMS - 1].list, "rlist_prev");

	i = 0;
	rlist_foreach(rlist, &head) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}


	is(rlist_entry(&items[0].list, struct test, list), &items[0],
		"rlist_entry");
	is(rlist_first_entry(&head, struct test, list), &items[0],
		"rlist_first_entry");
	is(rlist_next_entry(&items[0], list), &items[1], "rlist_next_entry");
	is(rlist_prev_entry(&items[2], list), &items[1], "rlist_prev_entry");


	i = 0;
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (foreach_entry) %d", i);
		i++;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
	}

	rlist_del(&items[2].list);
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_move(&head2, &items[3].list);
	ok(!rlist_empty(&head2), "head2 isnt empty");
	is(rlist_first_entry(&head2, struct test, list),
					&items[3], "Item was moved");
	rlist_move_tail(&head2, &items[4].list);
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second deleted) %d", i);
		i++;
		if (i == 2)
			i += 3;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		if (i == 4)
			i -= 3;
		is(it, items + i, "element (second deleted) %d", i);
	}


	rlist_create(&head);
	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_reverse(it, &head, list) {
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry) %d", i);
	}
	rlist_create(&head);
	rlist_add_entry(&head, &items[0], list);
	ok(rlist_prev_entry_safe(&items[0], &head, list) == NULL,
	   "prev is null");

	rlist_create(&head);
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp)
		++i;
	ok(i == 0, "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp) {
		rlist_del_entry(it, list);
		is(it, items + i, "element (reverse) %d", i);
		i++;
	}
	rlist_add(&head, &items[0].list);
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	for (i = 1; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	rlist_cut_before(&head2, &head, &items[ITEMS / 2].list);
	i = 0;
	rlist_foreach_entry(it, &head2, list) {
		is(it, items + i, "element (first half) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second half) %d", i);
		i++;
	}

	footer();
	return check_plan();
}